

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

void CopyOptionValue(TidyDocImpl *doc,TidyOptionImpl *option,TidyOptionValue *oldval,
                    TidyOptionValue *newval)

{
  Bool BVar1;
  TidyOptionValue TVar2;
  
  if (oldval == (TidyOptionValue *)0x0) {
    __assert_fail("oldval != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/config.c"
                  ,0x185,
                  "void CopyOptionValue(TidyDocImpl *, const TidyOptionImpl *, TidyOptionValue *, const TidyOptionValue *)"
                 );
  }
  if (doc->pConfigChangeCallback == (TidyConfigChangeCallback)0x0) {
    BVar1 = no;
  }
  else if (option->type == TidyString) {
    BVar1 = OptionChangedValuesDiffer(oldval->p,newval->p);
  }
  else {
    BVar1 = (Bool)(oldval->v != newval->v);
  }
  FreeOptionValue(doc,option,oldval);
  if (option->type == TidyString) {
    TVar2 = (TidyOptionValue)newval->p;
    if (((ctmbstr)TVar2.v == (ctmbstr)0x0) || ((ctmbstr)TVar2.v == option->pdflt)) {
      *oldval = TVar2;
      goto LAB_001519dd;
    }
    TVar2.p = prvTidytmbstrdup(doc->allocator,TVar2.p);
  }
  else {
    TVar2 = *newval;
  }
  *oldval = TVar2;
LAB_001519dd:
  if ((BVar1 != no) && (doc->pConfigChangeCallback != (TidyConfigChangeCallback)0x0)) {
    (*doc->pConfigChangeCallback)((TidyDoc)doc,(TidyOption)option);
    return;
  }
  return;
}

Assistant:

static void CopyOptionValue( TidyDocImpl* doc, const TidyOptionImpl* option,
                             TidyOptionValue* oldval, const TidyOptionValue* newval )
{
    Bool fire_callback = no;
    assert( oldval != NULL );

    /* Compare the old and new values. */
    if ( doc->pConfigChangeCallback )
    {
        if ( option->type == TidyString )
            fire_callback = OptionChangedValuesDiffer( oldval->p, newval->p );
        else
            fire_callback = oldval->v != newval->v;
    }

    FreeOptionValue( doc, option, oldval );

    if ( option->type == TidyString )
    {
        if ( newval->p && newval->p != option->pdflt )
            oldval->p = TY_(tmbstrdup)( doc->allocator, newval->p );
        else
            oldval->p = newval->p;
    }
    else
        oldval->v = newval->v;

    if ( fire_callback )
        PerformOptionChangedCallback( doc, option );
}